

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

int luv_fs_scandir_next(lua_State *L)

{
  int status;
  char *local_40;
  char *type;
  undefined1 auStack_30 [4];
  int ret;
  uv_dirent_t ent;
  uv_fs_t *req;
  lua_State *L_local;
  
  ent._8_8_ = luv_check_fs(L,1);
  status = uv_fs_scandir_next((uv_fs_t *)ent._8_8_,(uv_dirent_t *)auStack_30);
  if (status == -0xfff) {
    luv_cleanup_req(L,*(luv_req_t **)ent._8_8_);
    *(undefined8 *)ent._8_8_ = 0;
    uv_fs_req_cleanup((uv_fs_t *)ent._8_8_);
    L_local._4_4_ = 0;
  }
  else if (status < 0) {
    L_local._4_4_ = luv_error(L,status);
  }
  else {
    lua_pushstring(L,_auStack_30);
    switch(ent.name._0_4_) {
    case 0:
      return 1;
    case 1:
      local_40 = "file";
      break;
    case 2:
      local_40 = "directory";
      break;
    case 3:
      local_40 = "link";
      break;
    case 4:
      local_40 = "fifo";
      break;
    case 5:
      local_40 = "socket";
      break;
    case 6:
      local_40 = "char";
      break;
    case 7:
      local_40 = "block";
      break;
    default:
      local_40 = "unknown";
    }
    lua_pushstring(L,local_40);
    L_local._4_4_ = 2;
  }
  return L_local._4_4_;
}

Assistant:

static int luv_fs_scandir_next(lua_State* L) {
  uv_fs_t* req = luv_check_fs(L, 1);
  uv_dirent_t ent;
  int ret = uv_fs_scandir_next(req, &ent);
  if (ret == UV_EOF) {
    luv_cleanup_req(L, (luv_req_t*)req->data);
    req->data = NULL;
    uv_fs_req_cleanup(req);
    return 0;
  }
  if (ret < 0) return luv_error(L, ret);
  return luv_push_dirent(L, &ent, 0);
}